

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O2

UniValue *
JSONRPCRequestObj(UniValue *__return_storage_ptr__,string *strMethod,UniValue *params,UniValue *id)

{
  long in_FS_OFFSET;
  string in_stack_fffffffffffffdc8;
  UniValue in_stack_fffffffffffffde8;
  UniValue local_1b8;
  string local_160 [32];
  UniValue local_140;
  string local_e8 [32];
  UniValue local_c8;
  string local_70 [32];
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  UniValue::UniValue(__return_storage_ptr__,VOBJ,in_stack_fffffffffffffdc8);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"method",(allocator<char> *)&stack0xfffffffffffffdcf);
  UniValue::
  UniValue<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_c8,strMethod);
  UniValue::pushKV(__return_storage_ptr__,in_stack_fffffffffffffdc8,in_stack_fffffffffffffde8);
  UniValue::~UniValue(&local_c8);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::string<std::allocator<char>>
            (local_e8,"params",(allocator<char> *)&stack0xfffffffffffffdcf);
  UniValue::UniValue(&local_140,params);
  UniValue::pushKV(__return_storage_ptr__,in_stack_fffffffffffffdc8,in_stack_fffffffffffffde8);
  UniValue::~UniValue(&local_140);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_160,"id",(allocator<char> *)&stack0xfffffffffffffdcf);
  UniValue::UniValue(&local_1b8,id);
  UniValue::pushKV(__return_storage_ptr__,in_stack_fffffffffffffdc8,in_stack_fffffffffffffde8);
  UniValue::~UniValue(&local_1b8);
  std::__cxx11::string::~string(local_160);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffe28,"jsonrpc",
             (allocator<char> *)&stack0xfffffffffffffdcf);
  UniValue::UniValue<const_char_(&)[4],_char[4],_true>
            ((UniValue *)&stack0xfffffffffffffdd0,(char (*) [4])0xbc907c);
  UniValue::pushKV(__return_storage_ptr__,in_stack_fffffffffffffdc8,in_stack_fffffffffffffde8);
  UniValue::~UniValue((UniValue *)&stack0xfffffffffffffdd0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue JSONRPCRequestObj(const std::string& strMethod, const UniValue& params, const UniValue& id)
{
    UniValue request(UniValue::VOBJ);
    request.pushKV("method", strMethod);
    request.pushKV("params", params);
    request.pushKV("id", id);
    request.pushKV("jsonrpc", "2.0");
    return request;
}